

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

void __thiscall flatbuffers::Parser::ParseDecl(Parser *this)

{
  Definition *pDVar1;
  StructDef *pSVar2;
  bool bVar3;
  int iVar4;
  reference ppSVar5;
  Value *pVVar6;
  char *__nptr;
  vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_> *this_00;
  byte local_179;
  allocator local_131;
  string local_130;
  ulong local_110;
  size_t align;
  string local_100;
  Value *local_e0;
  Value *force_align;
  string local_d0;
  StructDef **local_b0;
  StructDef *local_a8;
  StructDef **local_a0;
  __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  StructDef *local_70;
  StructDef *struct_def;
  string name;
  string local_30 [7];
  bool fixed;
  string dc;
  Parser *this_local;
  
  dc.field_2._8_8_ = this;
  std::__cxx11::string::string(local_30,(string *)&this->doc_comment_);
  bVar3 = IsNext(this,6);
  if (!bVar3) {
    Expect(this,5);
  }
  std::__cxx11::string::string((string *)&struct_def,(string *)&this->attribute_);
  Expect(this,4);
  local_70 = LookupCreateStruct(this,(string *)&struct_def);
  if ((local_70->predecl & 1U) == 0) {
    std::operator+(&local_90,"datatype already exists: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&struct_def)
    ;
    Error(&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  local_70->predecl = false;
  std::__cxx11::string::operator=((string *)local_70,(string *)&struct_def);
  std::__cxx11::string::operator=((string *)&(local_70->super_Definition).doc_comment,local_30);
  local_70->fixed = bVar3;
  this_00 = &(this->structs_).vec;
  local_98._M_current =
       (StructDef **)
       std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::begin
                 (this_00);
  local_a0 = (StructDef **)
             std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::end
                       (this_00);
  local_a8 = local_70;
  local_b0 = (StructDef **)
             std::
             remove<__gnu_cxx::__normal_iterator<flatbuffers::StructDef**,std::vector<flatbuffers::StructDef*,std::allocator<flatbuffers::StructDef*>>>,flatbuffers::StructDef*>
                       (local_98,(__normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                                  )local_a0,&local_a8);
  pSVar2 = local_70;
  ppSVar5 = std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::back
                      (&(this->structs_).vec);
  *ppSVar5 = pSVar2;
  ParseMetaData(this,&local_70->super_Definition);
  pDVar1 = &local_70->super_Definition;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d0,"original_order",(allocator *)((long)&force_align + 7));
  pVVar6 = SymbolTable<flatbuffers::Value>::Lookup(&pDVar1->attributes,&local_d0);
  local_179 = 0;
  if (pVVar6 == (Value *)0x0) {
    local_179 = bVar3 ^ 0xff;
  }
  local_70->sortbysize = (bool)(local_179 & 1);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&force_align + 7));
  Expect(this,0x7b);
  while (this->token_ != 0x7d) {
    ParseField(this,local_70);
  }
  pDVar1 = &local_70->super_Definition;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"force_align",(allocator *)((long)&align + 7));
  pVVar6 = SymbolTable<flatbuffers::Value>::Lookup(&pDVar1->attributes,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&align + 7));
  local_e0 = pVVar6;
  if ((bVar3) && (pVVar6 != (Value *)0x0)) {
    __nptr = (char *)std::__cxx11::string::c_str();
    iVar4 = atoi(__nptr);
    local_110 = (ulong)iVar4;
    if (((local_e0->type).base_type != BASE_TYPE_INT) ||
       (((local_110 < local_70->minalign || (0x100 < local_110)) ||
        ((local_110 & local_110 - 1) != 0)))) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_130,
                 "force_align must be a power of two integer ranging from thestruct\'s natural alignment to 256"
                 ,&local_131);
      Error(&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
    }
    local_70->minalign = local_110;
  }
  StructDef::PadLastField(local_70,local_70->minalign);
  Expect(this,0x7d);
  std::__cxx11::string::~string((string *)&struct_def);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Parser::ParseDecl() {
  std::string dc = doc_comment_;
  bool fixed = IsNext(kTokenStruct);
  if (!fixed) Expect(kTokenTable);
  std::string name = attribute_;
  Expect(kTokenIdentifier);
  auto &struct_def = *LookupCreateStruct(name);
  if (!struct_def.predecl) Error("datatype already exists: " + name);
  struct_def.predecl = false;
  struct_def.name = name;
  struct_def.doc_comment = dc;
  struct_def.fixed = fixed;
  // Move this struct to the back of the vector just in case it was predeclared,
  // to preserve declartion order.
  remove(structs_.vec.begin(), structs_.vec.end(), &struct_def);
  structs_.vec.back() = &struct_def;
  ParseMetaData(struct_def);
  struct_def.sortbysize =
    struct_def.attributes.Lookup("original_order") == nullptr && !fixed;
  Expect('{');
  while (token_ != '}') ParseField(struct_def);
  auto force_align = struct_def.attributes.Lookup("force_align");
  if (fixed && force_align) {
    auto align = static_cast<size_t>(atoi(force_align->constant.c_str()));
    if (force_align->type.base_type != BASE_TYPE_INT ||
        align < struct_def.minalign ||
        align > 256 ||
        align & (align - 1))
      Error("force_align must be a power of two integer ranging from the"
            "struct\'s natural alignment to 256");
    struct_def.minalign = align;
  }
  struct_def.PadLastField(struct_def.minalign);
  Expect('}');
}